

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::
ExceptionOr<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>::
~ExceptionOr(ExceptionOr<kj::_::Tuple<kj::Own<kj::AsyncOutputStream>,_kj::Promise<kj::HttpClient::Response>_>_>
             *this)

{
  PromiseNode *pPVar1;
  Disposer *pDVar2;
  AsyncOutputStream *pAVar3;
  
  if ((this->value).ptr.isSet == true) {
    pPVar1 = (this->value).ptr.field_1.value.impl.
             super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.super_PromiseBase.
             node.ptr;
    if (pPVar1 != (PromiseNode *)0x0) {
      (this->value).ptr.field_1.value.impl.
      super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.super_PromiseBase.node.
      ptr = (PromiseNode *)0x0;
      pDVar2 = (this->value).ptr.field_1.value.impl.
               super_TupleElement<1U,_kj::Promise<kj::HttpClient::Response>_>.value.
               super_PromiseBase.node.disposer;
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(_func_int *)
                        ((long)&pPVar1->_vptr_PromiseNode + (long)pPVar1->_vptr_PromiseNode[-2]));
    }
    pAVar3 = (this->value).ptr.field_1.value.impl.
             super_TupleElement<0U,_kj::Own<kj::AsyncOutputStream>_>.value.ptr;
    if (pAVar3 != (AsyncOutputStream *)0x0) {
      (this->value).ptr.field_1.value.impl.super_TupleElement<0U,_kj::Own<kj::AsyncOutputStream>_>.
      value.ptr = (AsyncOutputStream *)0x0;
      pDVar2 = (this->value).ptr.field_1.value.impl.
               super_TupleElement<0U,_kj::Own<kj::AsyncOutputStream>_>.value.disposer;
      (**pDVar2->_vptr_Disposer)
                (pDVar2,(_func_int *)
                        ((long)&pAVar3->_vptr_AsyncOutputStream +
                        (long)pAVar3->_vptr_AsyncOutputStream[-2]));
    }
  }
  if ((this->super_ExceptionOrValue).exception.ptr.isSet == true) {
    Exception::~Exception(&(this->super_ExceptionOrValue).exception.ptr.field_1.value);
    return;
  }
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}